

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::RegexMatcher::appendTail(RegexMatcher *this,UnicodeString *dest)

{
  UErrorCode status;
  UText resultText;
  UErrorCode local_b4;
  UText local_b0;
  
  local_b4 = U_ZERO_ERROR;
  memset(&local_b0,0,0x90);
  local_b0.magic = 0x345ad82c;
  local_b0.sizeOfStruct = 0x90;
  utext_openUnicodeString_63(&local_b0,dest,&local_b4);
  if (local_b4 < U_ILLEGAL_ARGUMENT_ERROR) {
    appendTail(this,&local_b0,&local_b4);
    utext_close_63(&local_b0);
  }
  return dest;
}

Assistant:

UnicodeString &RegexMatcher::appendTail(UnicodeString &dest) {
    UErrorCode status = U_ZERO_ERROR;
    UText resultText = UTEXT_INITIALIZER;
    utext_openUnicodeString(&resultText, &dest, &status);

    if (U_SUCCESS(status)) {
        appendTail(&resultText, status);
        utext_close(&resultText);
    }

    return dest;
}